

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::~TcpSocketImpl(TcpSocketImpl *this)

{
  bool bVar1;
  bool bIsLocked;
  TcpSocketImpl *this_local;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpSocketImpl_001b9360;
  (this->super_BaseSocketImpl).m_bStop = true;
  bVar1 = std::mutex::try_lock(&(this->super_BaseSocketImpl).m_mxWrite);
  this->m_bCloseReq = true;
  std::__atomic_base<unsigned_long>::operator=
            (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,0);
  std::condition_variable::notify_all();
  if (bVar1) {
    std::mutex::unlock(&(this->super_BaseSocketImpl).m_mxWrite);
  }
  bVar1 = std::thread::joinable(&this->m_thConnect);
  if (bVar1) {
    std::thread::join();
  }
  if ((this->super_BaseSocketImpl).m_fSock != -1) {
    close((this->super_BaseSocketImpl).m_fSock);
    (this->super_BaseSocketImpl).m_fSock = -1;
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
  }
  std::function<void_(TcpSocketImpl_*)>::~function(&this->m_fClientConnectedSsl);
  std::function<void_(TcpSocket_*,_void_*)>::~function(&this->m_fBytesReceivedParam);
  std::function<void_(TcpSocket_*)>::~function(&this->m_fBytesReceived);
  std::__cxx11::string::~string((string *)&this->m_strIFaceAddr);
  std::__cxx11::string::~string((string *)&this->m_strClientAddr);
  std::condition_variable::~condition_variable(&this->m_cv);
  std::thread::~thread(&this->m_thConnect);
  std::function<void_(TcpSocket_*,_void_*)>::~function(&this->m_fClientConnectedParam);
  std::function<void_(TcpSocket_*)>::~function(&this->m_fClientConnected);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quOutData);
  std::function<int_(const_unsigned_char_*,_unsigned_long)>::~function(&this->m_fnSslEncode);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quInData);
  std::function<int_(const_unsigned_char_*,_unsigned_long,_bool_&)>::~function(&this->m_fnSslDecode)
  ;
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quTmpOutData);
  std::function<int_()>::~function(&this->m_fnSslInitDone);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

TcpSocketImpl::~TcpSocketImpl()
{
    //OutputDebugString(L"TcpSocketImpl::~TcpSocketImpl\r\n");
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_thConnect.joinable() == true)
        m_thConnect.join();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        StartClosingCB();
    }
}